

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigOutDec.c
# Opt level: O2

Vec_Ptr_t * Saig_ManFindPrimes(Aig_Man_t *pAig,int nLits,int fVerbose)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Cnf_Dat_t *p;
  sat_solver *s;
  void *pvVar4;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *p_01;
  void **ppvVar5;
  Vec_Int_t *p_02;
  Aig_Obj_t *pAVar6;
  Vec_Int_t *pVVar7;
  Aig_Obj_t *pAVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  Aig_Obj_t *pRoot;
  uint local_64;
  int *local_60;
  int Lits [10];
  
  if (1 < nLits - 1U) {
    __assert_fail("nLits == 1 || nLits == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigOutDec.c"
                  ,0x38,"Vec_Ptr_t *Saig_ManFindPrimes(Aig_Man_t *, int, int)");
  }
  p = Cnf_DeriveSimple(pAig,pAig->nObjs[3]);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p,1,0);
  pvVar4 = Vec_PtrEntry(pAig->vCos,0);
  pRoot = (Aig_Obj_t *)(*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe);
  p_00 = Aig_ManDfsNodes(pAig,&pRoot,1);
  p_01 = (Vec_Ptr_t *)malloc(0x10);
  p_01->nCap = 100;
  p_01->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  p_01->pArray = ppvVar5;
  iVar10 = p_00->nSize;
  p_02 = Vec_IntAlloc(iVar10);
  p_02->nSize = iVar10;
  local_60 = p_02->pArray;
  memset(local_60,0,(long)iVar10 * 4);
  Lits[0] = p->pVarNums[*(int *)((long)pvVar4 + 0x24)] * 2 + 1;
  for (lVar12 = 0; uVar9 = (ulong)p_00->nSize, lVar12 < (long)uVar9; lVar12 = lVar12 + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p_00,(int)lVar12);
    if (pAVar6 != pRoot) {
      Lits[1] = (*(uint *)&pAVar6->field_0x18 >> 3 & 1) + p->pVarNums[pAVar6->Id] * 2;
      iVar2 = sat_solver_solve(s,Lits,Lits + 2,0,0,0,0);
      if (iVar2 == -1) {
        pVVar7 = Vec_IntAlloc(1);
        Vec_IntPush(pVVar7,(*(uint *)&pAVar6->field_0x18 >> 3 & 1) + pAVar6->Id * 2);
        Vec_PtrPush(p_01,pVVar7);
        if (fVerbose != 0) {
          printf("Adding prime %d%c\n",(ulong)(uint)pAVar6->Id,
                 (ulong)(((*(uint *)&pAVar6->field_0x18 & 8) >> 2) + 0x2b));
        }
        if (iVar10 <= lVar12) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        local_60[lVar12] = 1;
      }
    }
  }
  uVar11 = p_01->nSize;
  uVar1 = uVar11;
  if (1 < nLits) {
    local_64 = uVar11;
    for (iVar10 = 0; iVar10 < (int)uVar9; iVar10 = iVar10 + 1) {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p_00,iVar10);
      iVar2 = iVar10;
      if (pAVar6 == pRoot) {
        uVar11 = p_00->nSize;
      }
      else {
LAB_00545864:
        iVar2 = iVar2 + 1;
        uVar11 = p_00->nSize;
        if (iVar2 < (int)uVar11) {
          pAVar8 = (Aig_Obj_t *)Vec_PtrEntry(p_00,iVar2);
          if (((pAVar8 != pRoot) && (iVar3 = Vec_IntEntry(p_02,iVar10), iVar3 == 0)) &&
             (iVar3 = Vec_IntEntry(p_02,iVar2), iVar3 == 0)) {
            uVar9 = 0;
            while (uVar11 = (uint)uVar9, uVar11 != 3) {
              uVar1 = (uint)(uVar9 >> 1);
              Lits[1] = ((*(uint *)&pAVar6->field_0x18 >> 3 ^ uVar11) & 1) +
                        p->pVarNums[pAVar6->Id] * 2;
              Lits[2] = (uint)(uVar1 != ((*(uint *)&pAVar8->field_0x18 >> 3 & 1) != 0)) +
                        p->pVarNums[pAVar8->Id] * 2;
              iVar3 = sat_solver_solve(s,Lits,Lits + 3,0,0,0,0);
              if (iVar3 == -1) {
                pVVar7 = Vec_IntAlloc(2);
                Vec_IntPush(pVVar7,((*(uint *)&pAVar6->field_0x18 >> 3 ^ uVar11) & 1) +
                                   pAVar6->Id * 2);
                Vec_IntPush(pVVar7,(uint)(uVar1 != ((*(uint *)&pAVar8->field_0x18 >> 3 & 1) != 0)) +
                                   pAVar8->Id * 2);
                Vec_PtrPush(p_01,pVVar7);
                if (fVerbose != 0) {
                  printf("Adding prime %d%c %d%c\n",(ulong)(uint)pAVar6->Id,
                         (ulong)(((*(uint *)&pAVar6->field_0x18 >> 3 ^ uVar11) & 1) * 2 + 0x2b),
                         (ulong)(uint)pAVar8->Id);
                }
                break;
              }
              uVar9 = (ulong)(uVar11 + 1);
            }
          }
          goto LAB_00545864;
        }
      }
      uVar9 = (ulong)uVar11;
    }
    uVar11 = p_01->nSize;
    uVar1 = local_64;
  }
  printf("Property cone size = %6d    1-lit primes = %5d    2-lit primes = %5d\n",uVar9,(ulong)uVar1
         ,(ulong)(uVar11 - uVar1));
  sat_solver_delete(s);
  Cnf_DataFree(p);
  Vec_PtrFree(p_00);
  free(local_60);
  free(p_02);
  return p_01;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Performs decomposition of the property output.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Ptr_t * Saig_ManFindPrimes( Aig_Man_t * pAig, int nLits, int fVerbose )
{
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    Aig_Obj_t * pObj0, * pObj1, * pRoot, * pMiter;
    Vec_Ptr_t * vPrimes, * vNodes;
    Vec_Int_t * vCube, * vMarks;
    int i0, i1, m, RetValue, Lits[10];
    int fCompl0, fCompl1, nNodes1, nNodes2;
    assert( nLits == 1 || nLits == 2 );
    assert( nLits < 10 );

    // create SAT solver
    pCnf = Cnf_DeriveSimple( pAig, Aig_ManCoNum(pAig) ); 
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );

    // collect nodes in the property output cone
    pMiter = Aig_ManCo( pAig, 0 );
    pRoot  = Aig_ObjFanin0( pMiter );
    vNodes = Aig_ManDfsNodes( pAig, &pRoot, 1 );
    // sort nodes by level and remove the last few
 
    // try single nodes
    vPrimes = Vec_PtrAlloc( 100 );
    // create assumptions
    vMarks = Vec_IntStart( Vec_PtrSize(vNodes) );
    Lits[0] = toLitCond( pCnf->pVarNums[Aig_ObjId(pMiter)], 1 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj0, i0 )
    if ( pObj0 != pRoot )
    {
        // create assumptions
        Lits[1] = toLitCond( pCnf->pVarNums[Aig_ObjId(pObj0)], pObj0->fPhase );
        // solve the problem
        RetValue = sat_solver_solve( pSat, Lits, Lits+2, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( RetValue == l_False )
        {
            vCube = Vec_IntAlloc( 1 );
            Vec_IntPush( vCube, toLitCond(Aig_ObjId(pObj0), pObj0->fPhase) );
            Vec_PtrPush( vPrimes, vCube );
            if ( fVerbose )
            printf( "Adding prime %d%c\n", Aig_ObjId(pObj0),  pObj0->fPhase?'-':'+' );
            Vec_IntWriteEntry( vMarks, i0, 1 );
        }
    }
    nNodes1 = Vec_PtrSize(vPrimes);
    if ( nLits > 1 )
    {
        // try adding second literal
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj0, i0 )
        if ( pObj0 != pRoot )
        Vec_PtrForEachEntryStart( Aig_Obj_t *, vNodes, pObj1, i1, i0+1 )
        if ( pObj1 != pRoot )
        {
            if ( Vec_IntEntry(vMarks,i0) || Vec_IntEntry(vMarks,i1) )
                continue;
            for ( m = 0; m < 3; m++ )
            {
                fCompl0 =  m & 1;
                fCompl1 = (m >> 1) & 1;
                // create assumptions
                Lits[1] = toLitCond( pCnf->pVarNums[Aig_ObjId(pObj0)], fCompl0 ^ pObj0->fPhase );
                Lits[2] = toLitCond( pCnf->pVarNums[Aig_ObjId(pObj1)], fCompl1 ^ pObj1->fPhase );
                // solve the problem
                RetValue = sat_solver_solve( pSat, Lits, Lits+3, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
                if ( RetValue == l_False )
                {
                    vCube = Vec_IntAlloc( 2 );
                    Vec_IntPush( vCube, toLitCond(Aig_ObjId(pObj0), fCompl0 ^ pObj0->fPhase) );
                    Vec_IntPush( vCube, toLitCond(Aig_ObjId(pObj1), fCompl1 ^ pObj1->fPhase) );
                    Vec_PtrPush( vPrimes, vCube );
                    if ( fVerbose )
                    printf( "Adding prime %d%c %d%c\n", 
                        Aig_ObjId(pObj0), (fCompl0 ^ pObj0->fPhase)?'-':'+', 
                        Aig_ObjId(pObj1), (fCompl1 ^ pObj1->fPhase)?'-':'+' );
                    break;
                }
            }
        }
    }
    nNodes2 = Vec_PtrSize(vPrimes) - nNodes1;

    printf( "Property cone size = %6d    1-lit primes = %5d    2-lit primes = %5d\n", 
        Vec_PtrSize(vNodes), nNodes1, nNodes2 );

    // clean up
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    Vec_PtrFree( vNodes );
    Vec_IntFree( vMarks );
    return vPrimes;
}